

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fAttribLocationTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles2::Functional::createAttributeLocationTests(Context *context)

{
  AttribType *type_00;
  deUint32 dVar1;
  TestCaseGroup *this;
  TestCaseGroup *pTVar2;
  BindAttributeTest *this_00;
  TestContext *pTVar3;
  RenderContext *pRVar4;
  BindMaxAttributesTest *this_01;
  BindAliasingAttributeTest *pBVar5;
  BindMaxAliasingAttributeTest *this_02;
  BindInactiveAliasingAttributeTest *this_03;
  BindHoleAttributeTest *this_04;
  PreAttachBindAttributeTest *this_05;
  PreLinkBindAttributeTest *this_06;
  PostLinkBindAttributeTest *this_07;
  BindRelinkAttributeTest *this_08;
  BindReattachAttributeTest *this_09;
  BindRelinkHoleAttributeTest *this_10;
  AttribType *local_550;
  AttribType *type_4;
  int typeNdx_4;
  TestCaseGroup *relinkHoleGroup;
  TestCaseGroup *bindTimeGroup;
  AttribType *type_3;
  int typeNdx_3;
  TestCaseGroup *holeGroup;
  AttribType *type_2;
  int typeNdx_2;
  TestCaseGroup *aliasingGroup;
  AttribType *type_1;
  int typeNdx_1;
  TestCaseGroup *bindMaxAttributeGroup;
  AttribType *type;
  int typeNdx;
  TestCaseGroup *bindAttributeGroup;
  TestCaseGroup *root;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_161;
  string local_160;
  AttribType *local_140;
  AttribType local_138 [4];
  AttribType local_98;
  AttribType local_70;
  AttribType local_48;
  undefined1 auStack_20 [16];
  Context *context_local;
  
  root._6_1_ = 1;
  local_140 = local_138;
  auStack_20._8_8_ = context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"float",&local_161);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_138,&local_160,1,0x1406);
  local_140 = local_138 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"vec2",&local_199);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_138 + 1,&local_198,1,0x8b50);
  local_140 = local_138 + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vec3",&local_1c1);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_138 + 2,&local_1c0,1,0x8b51);
  local_140 = local_138 + 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"vec4",&local_1e9);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_138 + 3,&local_1e8,1,0x8b52);
  local_140 = &local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"mat2",&local_211);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_98,&local_210,2,0x8b5a);
  local_140 = &local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"mat3",&local_239);
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_70,&local_238,3,0x8b5b);
  local_140 = &local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"mat4",(allocator<char> *)((long)&root + 7));
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_48,&local_260,4,0x8b5c);
  root._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)((long)&root + 7));
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,(Context *)auStack_20._8_8_,"attribute_location","Attribute location tests");
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(Context *)auStack_20._8_8_,"bind","Basic attribute binding tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type._4_4_ = 0; type._4_4_ < 7; type._4_4_ = type._4_4_ + 1) {
    this_00 = (BindAttributeTest *)operator_new(0xa8);
    pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
    pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
    deqp::gls::BindAttributeTest::BindAttributeTest(this_00,pTVar3,pRVar4,local_138 + type._4_4_,-1)
    ;
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_00);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(Context *)auStack_20._8_8_,"bind_max_attributes",
             "Test using maximum attributes with bind.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_1._4_4_ = 0; type_1._4_4_ < 7; type_1._4_4_ = type_1._4_4_ + 1) {
    this_01 = (BindMaxAttributesTest *)operator_new(0xa8);
    pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
    pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
    deqp::gls::BindMaxAttributesTest::BindMaxAttributesTest
              (this_01,pTVar3,pRVar4,local_138 + type_1._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_01);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(Context *)auStack_20._8_8_,"bind_aliasing",
             "Test attribute location aliasing with bind.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_2._4_4_ = 0; type_2._4_4_ < 7; type_2._4_4_ = type_2._4_4_ + 1) {
    type_00 = local_138 + type_2._4_4_;
    pBVar5 = (BindAliasingAttributeTest *)operator_new(0xa8);
    pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
    pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
    deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
              (pBVar5,pTVar3,pRVar4,type_00,0,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pBVar5);
    dVar1 = deqp::gls::AttributeLocationTestUtil::AttribType::getLocationSize(type_00);
    if (1 < dVar1) {
      pBVar5 = (BindAliasingAttributeTest *)operator_new(0xa8);
      pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
      pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
      deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
                (pBVar5,pTVar3,pRVar4,type_00,1,-1);
      tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pBVar5);
    }
    this_02 = (BindMaxAliasingAttributeTest *)operator_new(0xa8);
    pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
    pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
    deqp::gls::BindMaxAliasingAttributeTest::BindMaxAliasingAttributeTest
              (this_02,pTVar3,pRVar4,type_00,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_02);
    this_03 = (BindInactiveAliasingAttributeTest *)operator_new(0xa8);
    pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
    pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
    deqp::gls::BindInactiveAliasingAttributeTest::BindInactiveAliasingAttributeTest
              (this_03,pTVar3,pRVar4,type_00,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_03);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(Context *)auStack_20._8_8_,"bind_hole",
             "Bind all, but one attribute and leave hole in location space for it.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_3._4_4_ = 0; type_3._4_4_ < 7; type_3._4_4_ = type_3._4_4_ + 1) {
    this_04 = (BindHoleAttributeTest *)operator_new(0xa8);
    pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
    pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
    deqp::gls::BindHoleAttributeTest::BindHoleAttributeTest
              (this_04,pTVar3,pRVar4,local_138 + type_3._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_04);
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(Context *)auStack_20._8_8_,"bind_time",
             "Bind time tests. Test binding at different stages.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  this_05 = (PreAttachBindAttributeTest *)operator_new(0x78);
  pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
  pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
  deqp::gls::PreAttachBindAttributeTest::PreAttachBindAttributeTest(this_05,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_05);
  this_06 = (PreLinkBindAttributeTest *)operator_new(0x78);
  pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
  pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
  deqp::gls::PreLinkBindAttributeTest::PreLinkBindAttributeTest(this_06,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_06);
  this_07 = (PostLinkBindAttributeTest *)operator_new(0x78);
  pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
  pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
  deqp::gls::PostLinkBindAttributeTest::PostLinkBindAttributeTest(this_07,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_07);
  this_08 = (BindRelinkAttributeTest *)operator_new(0x78);
  pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
  pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
  deqp::gls::BindRelinkAttributeTest::BindRelinkAttributeTest(this_08,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_08);
  this_09 = (BindReattachAttributeTest *)operator_new(0x78);
  pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
  pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
  deqp::gls::BindReattachAttributeTest::BindReattachAttributeTest(this_09,pTVar3,pRVar4);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_09);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(Context *)auStack_20._8_8_,"bind_relink_hole",
             "Test relinking with moving hole in attribute location space.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  for (type_4._4_4_ = 0; type_4._4_4_ < 7; type_4._4_4_ = type_4._4_4_ + 1) {
    this_10 = (BindRelinkHoleAttributeTest *)operator_new(0xa8);
    pTVar3 = gles2::Context::getTestContext((Context *)auStack_20._8_8_);
    pRVar4 = gles2::Context::getRenderContext((Context *)auStack_20._8_8_);
    deqp::gls::BindRelinkHoleAttributeTest::BindRelinkHoleAttributeTest
              (this_10,pTVar3,pRVar4,local_138 + type_4._4_4_,-1);
    tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_10);
  }
  local_550 = (AttribType *)auStack_20;
  context_local = (Context *)this;
  do {
    local_550 = local_550 + -1;
    deqp::gls::AttributeLocationTestUtil::AttribType::~AttribType(local_550);
  } while (local_550 != local_138);
  return (TestCaseGroup *)context_local;
}

Assistant:

TestCaseGroup* createAttributeLocationTests (Context& context)
{
	const AttribType	types[] =
	{
		AttribType("float",	1,  GL_FLOAT),
		AttribType("vec2",	1,  GL_FLOAT_VEC2),
		AttribType("vec3",	1,  GL_FLOAT_VEC3),
		AttribType("vec4",	1,  GL_FLOAT_VEC4),

		AttribType("mat2",	2,  GL_FLOAT_MAT2),
		AttribType("mat3",	3,  GL_FLOAT_MAT3),
		AttribType("mat4",	4,  GL_FLOAT_MAT4)
	};

	TestCaseGroup* const root = new TestCaseGroup (context, "attribute_location", "Attribute location tests");

	// Basic bind attribute tests
	{
		TestCaseGroup* const bindAttributeGroup = new TestCaseGroup(context, "bind", "Basic attribute binding tests.");

		root->addChild(bindAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindAttributeGroup->addChild(new gls::BindAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Bind max number of attributes
	{
		TestCaseGroup* const bindMaxAttributeGroup = new TestCaseGroup(context, "bind_max_attributes", "Test using maximum attributes with bind.");

		root->addChild(bindMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindMaxAttributeGroup->addChild(new gls::BindMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test aliasing
	{
		TestCaseGroup* const aliasingGroup = new TestCaseGroup(context, "bind_aliasing", "Test attribute location aliasing with bind.");

		root->addChild(aliasingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Simple aliasing cases
			aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// For types which occupy more than one location. Alias second location.
			if (type.getLocationSize() > 1)
				aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type, 1));

			// Use more than maximum attributes with conditional aliasing
			aliasingGroup->addChild(new gls::BindMaxAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// Use more than maximum attributes with inactive attributes
			aliasingGroup->addChild(new gls::BindInactiveAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test filling holes in attribute location
	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "bind_hole", "Bind all, but one attribute and leave hole in location space for it.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Bind first location, leave hole size of type and fill rest of locations
			holeGroup->addChild(new gls::BindHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test binding at different times
	{
		TestCaseGroup* const bindTimeGroup = new TestCaseGroup(context, "bind_time", "Bind time tests. Test binding at different stages.");

		root->addChild(bindTimeGroup);

		bindTimeGroup->addChild(new gls::PreAttachBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PreLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PostLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindRelinkAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindReattachAttributeTest(context.getTestContext(), context.getRenderContext()));
	}

	// Test relinking program
	{
		TestCaseGroup* const relinkHoleGroup = new TestCaseGroup(context, "bind_relink_hole", "Test relinking with moving hole in attribute location space.");

		root->addChild(relinkHoleGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			relinkHoleGroup->addChild(new gls::BindRelinkHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	return root;
}